

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

QSystemError createDirectoryWithParents(QByteArray *path,mode_t mode)

{
  QSystemError QVar1;
  qsizetype qVar2;
  long n;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  anon_class_16_2_3fa7beb7 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._12_4_ = 0xaaaaaaaa;
  local_38.mode = mode;
  local_38.path = path;
  QVar1 = createDirectoryWithParents::anon_class_16_2_3fa7beb7::operator()(&local_38);
  if (QVar1.errorCode == 2 && (ulong)QVar1 >> 0x20 != 0) {
    qVar2 = QByteArray::lastIndexOf(path,'/',-1);
    do {
      n = qVar2;
      if (n < 1) goto LAB_00373962;
      qVar2 = n + -1;
    } while ((path->d).ptr[n + -1] == '/');
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::first((QByteArray *)&local_58,path,n);
    QVar1 = createDirectoryWithParents((QByteArray *)&local_58,mode);
    if ((ulong)QVar1 >> 0x20 == 0) {
      QVar1 = createDirectoryWithParents::anon_class_16_2_3fa7beb7::operator()(&local_38);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  }
LAB_00373962:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

static QSystemError createDirectoryWithParents(const QByteArray &path, mode_t mode)
{
#ifdef Q_OS_WASM
    if (path == "/")
        return {};
#endif

    auto tryMkDir = [&path, mode]() -> QSystemError {
        if (QT_MKDIR(path, mode) == 0) {
#ifdef Q_OS_VXWORKS
            forceRequestedPermissionsOnVxWorks(path, mode);
#endif
            return {};
        }
        // On macOS with APFS mkdir sets errno to EISDIR, QTBUG-97110
        if (errno == EISDIR)
            return {};
        if (errno == EEXIST || errno == EROFS) {
            // ::mkdir() can fail if the dir already exists (it may have been
            // created by another thread or another process)
            QT_STATBUF st;
            if (QT_STAT(path.constData(), &st) != 0)
                return QSystemError::stdError(errno);
            const bool isDir = (st.st_mode & S_IFMT) == S_IFDIR;
            return isDir ? QSystemError{} : QSystemError::stdError(EEXIST);
        }
        return QSystemError::stdError(errno);
    };

    QSystemError result = tryMkDir();
    if (result.ok())
        return result;

    // Only handle non-existing dir components in the path
    if (result.errorCode != ENOENT)
        return result;

    qsizetype slash = path.lastIndexOf('/');
    while (slash > 0 && path[slash - 1] == '/')
        --slash;

    if (slash < 1)
        return result;

    // mkdir failed because the parent dir doesn't exist, so try to create it
    QByteArray parentPath = path.first(slash);
    if (result = createDirectoryWithParents(parentPath, mode); !result.ok())
        return result;

    // try again
    return tryMkDir();
}